

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O3

bool __thiscall SkipList::containsElement(SkipList *this,int value)

{
  bool bVar1;
  Element *pEVar2;
  long lVar3;
  pointer ppEVar4;
  Element *pEVar5;
  
  if ((long)this->height < 0) {
    ppEVar4 = (this->head).next.
              super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    pEVar2 = &this->head;
    lVar3 = (long)this->height;
    do {
      do {
        pEVar5 = pEVar2;
        ppEVar4 = (pEVar5->next).
                  super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pEVar2 = ppEVar4[lVar3];
      } while (ppEVar4[lVar3]->value < value);
      bVar1 = 0 < lVar3;
      pEVar2 = pEVar5;
      lVar3 = lVar3 + -1;
    } while (bVar1);
  }
  return (*ppEVar4)->value == value;
}

Assistant:

bool SkipList::containsElement(int value) {
    Element *p = &head;
    for (int i = height; i >= 0; --i) {
        while (p->next[i]->value < value) {
            p = p->next[i];
        }
    }

    // now either p == &head and x <= p->next[0]->key
    // or p != &head and p->key < x <= p->next[0]->key
    p = p->next[0];
    return p->value == value;  // x is at position p in list or in list
}